

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
cmLocalGenerator::GetMSVCDebugFormatName
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,cmLocalGenerator *this,string *config,cmGeneratorTarget *target)

{
  cmMakefile *this_00;
  cmValue cVar1;
  cmValue cVar2;
  string local_90;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  this_00 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"CMAKE_MSVC_DEBUG_INFORMATION_FORMAT_DEFAULT",
             (allocator<char> *)&local_70);
  cVar1 = cmMakefile::GetDefinition(this_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if ((cVar1.Value != (string *)0x0) && ((cVar1.Value)->_M_string_length != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"MSVC_DEBUG_INFORMATION_FORMAT",(allocator<char> *)&local_70);
    cVar2 = cmGeneratorTarget::GetProperty(target,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    if (cVar2.Value != (string *)0x0) {
      cVar1 = cVar2;
    }
    std::__cxx11::string::string((string *)&local_50,(string *)cVar1.Value);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    cmGeneratorExpression::Evaluate
              (&local_90,&local_50,this,config,target,(cmGeneratorExpressionDAGChecker *)0x0,
               (cmGeneratorTarget *)0x0,&local_70);
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)__return_storage_ptr__,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

cm::optional<std::string> cmLocalGenerator::GetMSVCDebugFormatName(
  std::string const& config, cmGeneratorTarget const* target)
{
  // MSVC debug information format selection is activated by the presence
  // of a default whether or not it is overridden by a property.
  cm::optional<std::string> msvcDebugInformationFormat;
  cmValue msvcDebugInformationFormatDefault = this->Makefile->GetDefinition(
    "CMAKE_MSVC_DEBUG_INFORMATION_FORMAT_DEFAULT");
  if (cmNonempty(msvcDebugInformationFormatDefault)) {
    cmValue msvcDebugInformationFormatValue =
      target->GetProperty("MSVC_DEBUG_INFORMATION_FORMAT");
    if (!msvcDebugInformationFormatValue) {
      msvcDebugInformationFormatValue = msvcDebugInformationFormatDefault;
    }
    msvcDebugInformationFormat = cmGeneratorExpression::Evaluate(
      *msvcDebugInformationFormatValue, this, config, target);
  }
  return msvcDebugInformationFormat;
}